

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graphics.cpp
# Opt level: O2

void nite::dropFrame(void)

{
  long lVar1;
  size_t in_RDX;
  size_t extraout_RDX;
  nite *this;
  long lVar2;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  this = (nite *)0x0;
  for (lVar2 = 0; lVar2 != 0x3c0; lVar2 = lVar2 + 0x50) {
    lVar1 = *(long *)((long)&targets[0].objects.
                             super__Vector_base<nite::Renderable_*,_std::allocator<nite::Renderable_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish + lVar2) -
            *(long *)((long)&targets[0].objects.
                             super__Vector_base<nite::Renderable_*,_std::allocator<nite::Renderable_*>_>
                             ._M_impl.super__Vector_impl_data._M_start + lVar2);
    if (lVar1 != 0) {
      this = this + (lVar1 >> 3);
      RenderTarget::clear((RenderTarget *)
                          ((long)&targets[0].objects.
                                  super__Vector_base<nite::Renderable_*,_std::allocator<nite::Renderable_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start + lVar2));
      in_RDX = extraout_RDX;
    }
  }
  toStr_abi_cxx11_(&local_80,this,in_RDX);
  std::operator+(&local_40,"drop frame request: ",&local_80);
  std::operator+(&local_60,&local_40," objects");
  print(&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_80);
  return;
}

Assistant:

void nite::dropFrame(){
	size_t total = 0;
  for(int c = 0; c < RenderTargetNumber; ++c){
		if(targets[c].objects.size() == 0) continue;
		total += targets[c].objects.size();
    	targets[c].clear();
  }
	nite::print("drop frame request: "+nite::toStr(total)+" objects");
}